

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  ulong uVar5;
  string *psVar6;
  bool local_23a;
  bool local_212;
  string local_1e0;
  string local_1c0 [32];
  long local_1a0;
  size_type dot_pos;
  undefined1 local_190 [8];
  string repVar;
  string lang;
  undefined1 local_148 [6];
  bool replaceExt;
  byte local_121;
  undefined1 local_120 [7];
  bool keptSourceExtension;
  undefined1 local_100 [8];
  string objectName;
  undefined1 local_d8 [5];
  bool subBinary;
  bool relBinary;
  undefined1 local_b8 [8];
  string relFromBinary;
  bool subSource;
  bool relSource;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string relFromSource;
  string *fullPath;
  char *customOutputExtension_local;
  bool *hasSourceExtension_local;
  string *dir_max_local;
  cmSourceFile *source_local;
  cmLocalGenerator *this_local;
  
  relFromSource.field_2._8_8_ = cmSourceFile::GetFullPath_abi_cxx11_(source);
  pcVar3 = GetCurrentSourceDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,pcVar3,&local_81);
  cmOutputConverter::ConvertToRelativePath
            ((string *)local_60,&this->super_cmOutputConverter,&local_80,
             (string *)relFromSource.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x932,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
  relFromBinary.field_2._M_local_buf[0xb] = (bVar2 ^ 0xffU) & 1;
  local_212 = false;
  if (relFromBinary.field_2._M_local_buf[0xb] != 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
    local_212 = *pcVar3 != '.';
  }
  relFromBinary.field_2._M_local_buf[10] = local_212;
  pcVar3 = GetCurrentBinaryDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,pcVar3,(allocator *)(objectName.field_2._M_local_buf + 0xf));
  cmOutputConverter::ConvertToRelativePath
            ((string *)local_b8,&this->super_cmOutputConverter,(string *)local_d8,
             (string *)relFromSource.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(objectName.field_2._M_local_buf + 0xf));
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
    objectName.field_2._M_local_buf[0xe] = (bVar2 ^ 0xffU) & 1;
    local_23a = false;
    if (objectName.field_2._M_local_buf[0xe] != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_b8);
      local_23a = *pcVar3 != '.';
    }
    objectName.field_2._M_local_buf[0xd] = local_23a;
    std::__cxx11::string::string((string *)local_100);
    if ((((relFromBinary.field_2._M_local_buf[0xb] & 1U) == 0) ||
        ((objectName.field_2._M_local_buf[0xe] & 1U) != 0)) &&
       (((relFromBinary.field_2._M_local_buf[10] & 1U) == 0 ||
        ((objectName.field_2._M_local_buf[0xd] & 1U) != 0)))) {
      if ((((objectName.field_2._M_local_buf[0xe] & 1U) == 0) ||
          ((relFromBinary.field_2._M_local_buf[0xb] & 1U) != 0)) &&
         (((objectName.field_2._M_local_buf[0xd] & 1U) == 0 ||
          ((relFromBinary.field_2._M_local_buf[10] & 1U) != 0)))) {
        uVar5 = std::__cxx11::string::length();
        uVar4 = std::__cxx11::string::length();
        if (uVar5 < uVar4) {
          std::__cxx11::string::operator=((string *)local_100,(string *)local_b8);
        }
        else {
          std::__cxx11::string::operator=((string *)local_100,(string *)local_60);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)local_100,(string *)local_b8);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)local_100,(string *)local_60);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
    if (bVar2) {
      this_00 = GetGlobalGenerator(this);
      this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
      bVar2 = cmake::GetIsInTryCompile(this_01);
      if (bVar2) {
        psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
        cmsys::SystemTools::GetFilenameName((string *)local_120,psVar6);
        std::__cxx11::string::operator=((string *)local_100,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
      }
    }
    local_121 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_148,"KEEP_EXTENSION",(allocator *)(lang.field_2._M_local_buf + 0xf));
    bVar2 = cmSourceFile::GetPropertyAsBool(source,(string *)local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::allocator<char>::~allocator((allocator<char> *)(lang.field_2._M_local_buf + 0xf));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      lang.field_2._M_local_buf[0xe] = NeedBackwardsCompatibility_2_4(this);
      if (!(bool)lang.field_2._M_local_buf[0xe]) {
        cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&repVar.field_2 + 8),source);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_190,"CMAKE_",(allocator *)((long)&dot_pos + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&dot_pos + 7));
          std::__cxx11::string::operator+=
                    ((string *)local_190,(string *)(repVar.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_190,"_OUTPUT_EXTENSION_REPLACE");
          lang.field_2._M_local_buf[0xe] = cmMakefile::IsOn(this->Makefile,(string *)local_190);
          std::__cxx11::string::~string((string *)local_190);
        }
        std::__cxx11::string::~string((string *)(repVar.field_2._M_local_buf + 8));
      }
      if (((lang.field_2._M_local_buf[0xe] & 1U) != 0) || (customOutputExtension != (char *)0x0)) {
        local_121 = 0;
        local_1a0 = std::__cxx11::string::rfind('\0',0x2e);
        if (local_1a0 != -1) {
          std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_100);
          std::__cxx11::string::operator=((string *)local_100,local_1c0);
          std::__cxx11::string::~string(local_1c0);
        }
      }
      if (customOutputExtension == (char *)0x0) {
        cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                  (&local_1e0,this->GlobalGenerator,source);
        std::__cxx11::string::operator+=((string *)local_100,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      else {
        std::__cxx11::string::operator+=((string *)local_100,customOutputExtension);
      }
    }
    if (hasSourceExtension != (bool *)0x0) {
      *hasSourceExtension = (bool)(local_121 & 1);
    }
    psVar6 = CreateSafeUniqueObjectFileName(this,(string *)local_100,dir_max);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_60);
    return __return_storage_ptr__;
  }
  __assert_fail("!relFromBinary.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                ,0x939,
                "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
               );
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource =
    this->ConvertToRelativePath(this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource.c_str());
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary =
    this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary.c_str());
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName.c_str())) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}